

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.hpp
# Opt level: O2

void __thiscall
duckdb::CSVColumnInfo::CSVColumnInfo(CSVColumnInfo *this,string *name_p,LogicalType *type_p)

{
  ::std::__cxx11::string::string((string *)this,(string *)name_p);
  LogicalType::LogicalType(&this->type,type_p);
  return;
}

Assistant:

CSVColumnInfo(const string &name_p, const LogicalType &type_p) : name(name_p), type(type_p) {
	}